

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgmesh.cpp
# Opt level: O0

void __thiscall TPZGeoMesh::PrintTopologicalInfo(TPZGeoMesh *this,ostream *out)

{
  ostream *poVar1;
  int64_t iVar2;
  int64_t iVar3;
  ostream *poVar4;
  TPZChunkVector<TPZGeoEl_*,_10> *this_00;
  TPZGeoEl **ppTVar5;
  ostream *in_RSI;
  TPZGeoNode *in_RDI;
  int64_t nelem;
  int64_t nnodes;
  int64_t i;
  int64_t in_stack_ffffffffffffffd8;
  long local_18;
  
  poVar1 = std::operator<<(in_RSI,"TITLE-> ");
  poVar1 = std::operator<<(poVar1,(string *)&in_RDI->fId);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(in_RSI,"Number of nodes       = ");
  iVar2 = TPZChunkVector<TPZGeoNode,_10>::NElements
                    ((TPZChunkVector<TPZGeoNode,_10> *)&in_RDI[8].fId);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(in_RSI,"Number of elements    = ");
  iVar2 = TPZChunkVector<TPZGeoEl_*,_10>::NElements
                    ((TPZChunkVector<TPZGeoEl_*,_10> *)&in_RDI[1].fId);
  iVar3 = TPZAdmChunkVector<TPZGeoEl_*,_10>::NFreeElements
                    ((TPZAdmChunkVector<TPZGeoEl_*,_10> *)0x1a26891);
  poVar4 = (ostream *)std::ostream::operator<<(poVar1,iVar2 - iVar3);
  std::operator<<(poVar4,"\n");
  std::operator<<(in_RSI,"\n\tGeometric Node Information:\n");
  this_00 = (TPZChunkVector<TPZGeoEl_*,_10> *)
            TPZChunkVector<TPZGeoNode,_10>::NElements
                      ((TPZChunkVector<TPZGeoNode,_10> *)&in_RDI[8].fId);
  for (local_18 = 0; local_18 < (long)this_00; local_18 = local_18 + 1) {
    TPZChunkVector<TPZGeoNode,_10>::operator[]
              ((TPZChunkVector<TPZGeoNode,_10> *)this_00,in_stack_ffffffffffffffd8);
    TPZGeoNode::Print(in_RDI,poVar1);
  }
  std::operator<<(in_RSI,"\n\tGeometric Element Information:\n");
  iVar2 = TPZChunkVector<TPZGeoEl_*,_10>::NElements
                    ((TPZChunkVector<TPZGeoEl_*,_10> *)&in_RDI[1].fId);
  for (local_18 = 0; local_18 < iVar2; local_18 = local_18 + 1) {
    ppTVar5 = TPZChunkVector<TPZGeoEl_*,_10>::operator[](this_00,iVar2);
    if (*ppTVar5 != (TPZGeoEl *)0x0) {
      ppTVar5 = TPZChunkVector<TPZGeoEl_*,_10>::operator[](this_00,iVar2);
      (**(code **)(*(long *)*ppTVar5 + 0x1a8))(*ppTVar5,in_RSI);
    }
    std::operator<<(in_RSI,"\n");
  }
  return;
}

Assistant:

void TPZGeoMesh::PrintTopologicalInfo(std::ostream & out) const
{
	out << "TITLE-> " << fName << "\n";
	out << "Number of nodes       = " << fNodeVec.NElements() << "\n";
	out << "Number of elements    = " << fElementVec.NElements()-fElementVec.NFreeElements() << "\n";
	
	out << "\n\tGeometric Node Information:\n";
	int64_t i;
	int64_t nnodes = fNodeVec.NElements();
	for(i=0; i<nnodes; i++)
	{
		fNodeVec[i].Print(out);
	}
	out << "\n\tGeometric Element Information:\n";
	int64_t nelem = fElementVec.NElements();
	for(i=0; i<nelem; i++)
	{
		if(fElementVec[i]) fElementVec[i]->PrintTopologicalInfo(out);
		out << "\n";
	}
}